

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest1_2::executeTestIteration
          (FunctionalTest1_2 *this,_test_case *test_case)

{
  string *tc_body;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  GLenum GVar4;
  GLint GVar5;
  uint uVar6;
  uint uVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  TestError *pTVar9;
  void *xfb_data;
  void *xfb_data_ptr;
  uint local_a0;
  GLuint current_subroutine_index;
  uint n_subroutine_index;
  uint n_subroutine_indices;
  GLuint subroutine_indices [2];
  uint total_xfb_bo_size;
  uint iteration_xfb_bo_size;
  _variable_type base_variable_type;
  uint n_xfb_varyings;
  GLchar *xfb_varyings [1];
  undefined1 local_68 [8];
  string vs_body;
  string empty_body;
  bool result;
  Functions *gl;
  _test_case *test_case_local;
  FunctionalTest1_2 *this_local;
  Functions *gl_00;
  
  pRVar8 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar8->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar2);
  std::__cxx11::string::string((string *)(vs_body.field_2._M_local_buf + 8));
  getVertexShaderBody_abi_cxx11_
            ((string *)local_68,this,&test_case->variable_type,test_case->array_size);
  _base_variable_type = "result";
  iteration_xfb_bo_size = 1;
  tc_body = (string *)(&vs_body.field_2._M_allocated_capacity + 1);
  bVar1 = Utils::buildProgram(gl_00,(string *)local_68,tc_body,tc_body,tc_body,tc_body,
                              (GLchar **)&base_variable_type,&iteration_xfb_bo_size,&this->m_vs_id,
                              (GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,&this->m_po_id
                             );
  if (!bVar1) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Test program failed to build.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x89a);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  GVar3 = (*gl_00->getSubroutineIndex)(this->m_po_id,0x8b31,"getter0");
  this->m_po_getter0_subroutine_index = GVar3;
  GVar3 = (*gl_00->getSubroutineIndex)(this->m_po_id,0x8b31,"getter1");
  this->m_po_getter1_subroutine_index = GVar3;
  GVar4 = (*gl_00->getError)();
  glu::checkError(GVar4,"glGetSubroutineIndex() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x8a1);
  if ((this->m_po_getter0_subroutine_index != 0xffffffff) &&
     (this->m_po_getter1_subroutine_index != 0xffffffff)) {
    GVar5 = (*gl_00->getSubroutineUniformLocation)(this->m_po_id,0x8b31,"colorGetterUniform");
    this->m_po_subroutine_uniform_index = GVar5;
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"glGetSubroutineUniformLocation() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x8ab);
    if (this->m_po_subroutine_uniform_index == -1) {
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Subroutine uniform is considered inactive which is invalid.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x8af);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    total_xfb_bo_size = Utils::getBaseVariableType(&test_case->variable_type);
    uVar6 = Utils::getComponentSizeForVariableType(&total_xfb_bo_size);
    uVar7 = Utils::getNumberOfComponentsForVariableType(&test_case->variable_type);
    subroutine_indices[1] = uVar6 * uVar7;
    if (total_xfb_bo_size == 0) {
      subroutine_indices[1] = subroutine_indices[1] * 4;
    }
    subroutine_indices[0] = subroutine_indices[1] * 2;
    (*gl_00->bufferData)(0x8c8e,(ulong)subroutine_indices[0],(void *)0x0,0x88e4);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"glBufferData() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x8c2);
    (*gl_00->useProgram)(this->m_po_id);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"glUseProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x8c6);
    n_subroutine_index = this->m_po_getter0_subroutine_index;
    n_subroutine_indices = this->m_po_getter1_subroutine_index;
    current_subroutine_index = 2;
    for (local_a0 = 0; local_a0 < 2; local_a0 = local_a0 + 1) {
      xfb_data_ptr._4_4_ = (&n_subroutine_index)[local_a0];
      (*gl_00->uniformSubroutinesuiv)(0x8b31,1,(GLuint *)((long)&xfb_data_ptr + 4));
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glUniformSubroutinesuiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x8d2);
      (*gl_00->bindBufferRange)
                (0x8c8e,0,this->m_xfb_bo_id,(ulong)(subroutine_indices[1] * local_a0),
                 (ulong)subroutine_indices[1]);
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glBindBufferRange() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x8d7);
      (*gl_00->beginTransformFeedback)(0);
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glBeginTransformFeedback() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x8db);
      (*gl_00->drawArrays)(0,0,1);
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glDrawArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x8de);
      (*gl_00->endTransformFeedback)();
      GVar4 = (*gl_00->getError)();
      glu::checkError(GVar4,"glEndTransformFeedback() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                      ,0x8e1);
    }
    xfb_data = (*gl_00->mapBuffer)(0x8c8e,35000);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"glMapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x8e6);
    bVar1 = verifyXFBData(this,xfb_data,&test_case->variable_type);
    (*gl_00->unmapBuffer)(0x8c8e);
    GVar4 = (*gl_00->getError)();
    glu::checkError(GVar4,"glUnmapBuffeR() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0x8eb);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)(vs_body.field_2._M_local_buf + 8));
    return bVar1;
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,"At least one subroutine is considered inactive which is invalid.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
             ,0x8a5);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool FunctionalTest1_2::executeTestIteration(const _test_case& test_case)
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Build the test program */
	std::string		   empty_body;
	std::string		   vs_body		  = getVertexShaderBody(test_case.variable_type, test_case.array_size);
	const glw::GLchar* xfb_varyings[] = { "result" };
	const unsigned int n_xfb_varyings = sizeof(xfb_varyings) / sizeof(xfb_varyings[0]);

	if (!Utils::buildProgram(gl, vs_body, empty_body, empty_body, empty_body, empty_body, xfb_varyings, n_xfb_varyings,
							 &m_vs_id, NULL, /* out_tc_id */
							 NULL,			 /* out_te_id */
							 NULL,			 /* out_gs_id */
							 NULL, &m_po_id))
	{
		TCU_FAIL("Test program failed to build.");
	}

	/* Retrieve subroutine locations */
	m_po_getter0_subroutine_index = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "getter0");
	m_po_getter1_subroutine_index = gl.getSubroutineIndex(m_po_id, GL_VERTEX_SHADER, "getter1");

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineIndex() call(s) failed.");

	if (m_po_getter0_subroutine_index == GL_INVALID_INDEX || m_po_getter1_subroutine_index == GL_INVALID_INDEX)
	{
		TCU_FAIL("At least one subroutine is considered inactive which is invalid.");
	}

	/* Retrieve subroutine uniform location */
	m_po_subroutine_uniform_index = gl.getSubroutineUniformLocation(m_po_id, GL_VERTEX_SHADER, "colorGetterUniform");

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSubroutineUniformLocation() call failed.");

	if (m_po_subroutine_uniform_index == -1)
	{
		TCU_FAIL("Subroutine uniform is considered inactive which is invalid.");
	}

	/* Set up XFB BO storage */
	const Utils::_variable_type base_variable_type	= Utils::getBaseVariableType(test_case.variable_type);
	unsigned int				iteration_xfb_bo_size = Utils::getComponentSizeForVariableType(base_variable_type) *
										 Utils::getNumberOfComponentsForVariableType(test_case.variable_type);
	unsigned int total_xfb_bo_size = 0;

	if (base_variable_type == Utils::VARIABLE_TYPE_BOOL)
	{
		/* Boolean varyings are not supported by OpenGL. Instead, we use ints to output
		 * boolean values. */
		iteration_xfb_bo_size = static_cast<unsigned int>(iteration_xfb_bo_size * sizeof(int));
	}

	total_xfb_bo_size = iteration_xfb_bo_size * 2 /* subroutines we will be testing */;

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, total_xfb_bo_size, DE_NULL /* data */, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	/* Activate test program object */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Run two iterations. Each iteration should invoke different subroutine. */
	const glw::GLuint  subroutine_indices[] = { m_po_getter0_subroutine_index, m_po_getter1_subroutine_index };
	const unsigned int n_subroutine_indices = sizeof(subroutine_indices) / sizeof(subroutine_indices[0]);

	for (unsigned int n_subroutine_index = 0; n_subroutine_index < n_subroutine_indices; ++n_subroutine_index)
	{
		/* Configure which subroutine should be used for the draw call */
		glw::GLuint current_subroutine_index = subroutine_indices[n_subroutine_index];

		gl.uniformSubroutinesuiv(GL_VERTEX_SHADER, 1 /* count */, &current_subroutine_index);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUniformSubroutinesuiv() call failed.");

		/* Update XFB binding so that we do not overwrite data XFBed in previous iterations */
		gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
						   m_xfb_bo_id, iteration_xfb_bo_size * n_subroutine_index, iteration_xfb_bo_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() call failed.");

		/* Draw a single point */
		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");
		{
			gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");
		}
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");
	} /* for (all subroutine indices) */

	/* Map the BO storage into process space */
	const void* xfb_data_ptr = gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer() call failed.");

	result &= verifyXFBData(xfb_data_ptr, test_case.variable_type);

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffeR() call failed.");

	return result;
}